

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_ecmult.c
# Opt level: O3

void run_ecmult_multi_bench(bench_data *data,size_t count,int includes_g,int num_iters)

{
  uint64_t *puVar1;
  size_t sVar2;
  size_t sVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  secp256k1_scalar total;
  secp256k1_scalar tmp;
  secp256k1_fe aux [8];
  char str [32];
  secp256k1_ge pre_a [8];
  int iter;
  secp256k1_strauss_state local_8a0;
  secp256k1_scalar local_888;
  secp256k1_scalar local_868;
  secp256k1_fe local_848 [8];
  secp256k1_strauss_point_state local_708;
  secp256k1_ge local_2f8 [8];
  
  data->count = count;
  data->includes_g = 1;
  data->offset1 = (ulong)((int)count * 0x7f6f + 0x2481U & 0x7fff);
  data->offset2 = (ulong)((int)count * 0x537b + 0xf49U & 0x7fff);
  uVar5 = (ulong)(long)includes_g / count + 1;
  if (uVar5 != 0) {
    lVar6 = count - 1;
    uVar8 = 0;
    do {
      uVar7 = (ulong)(((uint)data->offset1 & 0x7fff) << 5);
      data->offset1 = data->offset1 + 1;
      puVar1 = (uint64_t *)((long)data->scalars->d + uVar7);
      local_888.d[0] = *puVar1;
      local_888.d[1] = puVar1[1];
      puVar1 = (uint64_t *)((long)data->scalars->d + uVar7 + 0x10);
      local_888.d[2] = *puVar1;
      local_888.d[3] = puVar1[1];
      lVar9 = lVar6;
      if (1 < count) {
        do {
          sVar2 = data->offset1;
          sVar3 = data->offset2;
          data->offset2 = sVar3 + 1;
          data->offset1 = sVar2 + 1;
          secp256k1_scalar_mul
                    (&local_868,
                     (secp256k1_scalar *)
                     ((long)data->seckeys->d + (ulong)(((uint)sVar3 & 0x7fff) << 5)),
                     (secp256k1_scalar *)
                     ((long)data->scalars->d + (ulong)(((uint)sVar2 & 0x7fff) << 5)));
          secp256k1_scalar_add(&local_888,&local_888,&local_868);
          lVar9 = lVar9 + -1;
        } while (lVar9 != 0);
      }
      secp256k1_scalar_negate(&local_888,&local_888);
      local_8a0.aux = local_848;
      local_8a0.pre_a = local_2f8;
      local_8a0.ps = &local_708;
      secp256k1_ecmult_strauss_wnaf
                (&local_8a0,data->expected_output + uVar8,1,(secp256k1_gej *)0x0,
                 &run_ecmult_multi_bench::zero,&local_888);
      uVar8 = uVar8 + 1;
    } while (uVar8 < uVar5);
  }
  iVar4 = (int)count;
  iter = iVar4;
  sprintf((char *)&local_708,"ecmult_multi_%ip_g",(ulong)(iVar4 - 1));
  run_benchmark((char *)&local_708,bench_ecmult_multi,bench_ecmult_multi_setup,
                bench_ecmult_multi_teardown,data,(int)uVar5 * iVar4,iter);
  return;
}

Assistant:

static void run_ecmult_multi_bench(bench_data* data, size_t count, int includes_g, int num_iters) {
    char str[32];
    static const secp256k1_scalar zero = SECP256K1_SCALAR_CONST(0, 0, 0, 0, 0, 0, 0, 0);
    size_t iters = 1 + num_iters / count;
    size_t iter;

    data->count = count;
    data->includes_g = includes_g;

    /* Compute (the negation of) the expected results directly. */
    hash_into_offset(data, data->count);
    for (iter = 0; iter < iters; ++iter) {
        secp256k1_scalar tmp;
        secp256k1_scalar total = data->scalars[(data->offset1++) % POINTS];
        size_t i = 0;
        for (i = 0; i + 1 < count; ++i) {
            secp256k1_scalar_mul(&tmp, &data->seckeys[(data->offset2++) % POINTS], &data->scalars[(data->offset1++) % POINTS]);
            secp256k1_scalar_add(&total, &total, &tmp);
        }
        secp256k1_scalar_negate(&total, &total);
        secp256k1_ecmult(&data->expected_output[iter], NULL, &zero, &total);
    }

    /* Run the benchmark. */
    if (includes_g) {
        sprintf(str, "ecmult_multi_%ip_g", (int)count - 1);
    } else {
        sprintf(str, "ecmult_multi_%ip", (int)count);
    }
    run_benchmark(str, bench_ecmult_multi, bench_ecmult_multi_setup, bench_ecmult_multi_teardown, data, 10, count * iters);
}